

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O1

void __thiscall
testing::internal::StreamingListener::OnTestIterationStart
          (StreamingListener *this,UnitTest *param_1,int iteration)

{
  long *plVar1;
  size_type *psVar2;
  int local_54;
  string local_50;
  string local_30;
  
  local_54 = iteration;
  StreamableToString<int>(&local_30,&local_54);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_30,0,(char *)0x0,0x13be5e);
  psVar2 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_50.field_2._M_allocated_capacity = *psVar2;
    local_50.field_2._8_8_ = plVar1[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar2;
    local_50._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_50._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  AbstractSocketWriter::SendLn((this->socket_writer_).ptr_,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void OnTestIterationStart(const UnitTest& /* unit_test */, int iteration) {
    SendLn("event=TestIterationStart&iteration=" +
           StreamableToString(iteration));
  }